

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

void __thiscall lzham::lzcompressor::lzcompressor(lzcompressor *this)

{
  long lVar1;
  
  init_params::init_params(&this->m_params);
  this->m_src_size = -1;
  this->m_src_adler32 = 0;
  search_accelerator::search_accelerator(&this->m_accel);
  symbol_codec::symbol_codec(&this->m_codec);
  memset(&this->m_stats,0,0xa54);
  memset(&(this->m_stats).m_total_delta_lit_cost,0,0x14d5);
  state::state(&this->m_initial_state);
  state::state(&this->m_state);
  this->m_num_parse_threads = 0;
  lVar1 = 0;
  do {
    raw_parse_thread_state::raw_parse_thread_state
              ((raw_parse_thread_state *)
               ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state.
                      super_state_base.m_match_hist + lVar1 + -0x10));
    lVar1 = lVar1 + 0xb2b00;
  } while (lVar1 != 0x595800);
  this->m_parse_jobs_remaining = 0;
  semaphore::semaphore(&this->m_parse_jobs_complete,0,1,(char *)0x0);
  return;
}

Assistant:

lzcompressor::lzcompressor() :
      m_src_size(-1),
      m_src_adler32(0),
      m_step(0),
      m_block_start_dict_ofs(0),
      m_block_index(0),
      m_finished(false),
      m_num_parse_threads(0),
      m_parse_jobs_remaining(0)
   {
      LZHAM_VERIFY( ((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0);
   }